

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdpfor.h
# Opt level: O3

uint32_t __thiscall
FastPForLib::SIMDPFor::compressblockPFOR
          (SIMDPFor *this,DATATYPE *in,uint32_t *outputbegin,uint32_t b,DATATYPE **exceptions)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  long lVar6;
  uint *puVar7;
  ulong uVar8;
  ulong uVar9;
  pointer puVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  
  if (b == 0x20) {
    memcpy(outputbegin,in,0x200);
  }
  else {
    uVar8 = 0;
    uVar13 = 1 << (b & 0x1f);
    puVar10 = (this->miss).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar6 = 0;
    do {
      puVar10[uVar8] = (uint)lVar6;
      uVar8 = (uVar8 + 1) - (ulong)(in[lVar6] < uVar13);
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x80);
    if (uVar8 != 0) {
      pvVar1 = &this->codedcopy;
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)pvVar1,in,in + 0x80);
      uVar2 = *(this->miss).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar9 = (ulong)uVar2;
      uVar3 = (this->codedcopy).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar9];
      puVar5 = *exceptions;
      puVar7 = puVar5 + 1;
      *exceptions = puVar7;
      *puVar5 = uVar3;
      if (b < 7) {
        if (uVar8 == 1) {
          puVar10 = (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start;
        }
        else {
          puVar10 = (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          uVar12 = 1;
          do {
            uVar3 = (this->miss).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar12];
            uVar11 = (uint)uVar9;
            puVar5 = puVar7;
            while (uVar11 + uVar13 < uVar3) {
              uVar11 = uVar13 + (int)uVar9;
              uVar4 = puVar10[uVar11];
              *exceptions = puVar5 + 1;
              *puVar5 = uVar4;
              puVar10 = (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_start;
              puVar10[uVar9] = uVar13 - 1;
              puVar5 = puVar5 + 1;
              uVar9 = (ulong)uVar11;
            }
            uVar4 = puVar10[uVar3];
            puVar7 = puVar5 + 1;
            uVar12 = (ulong)((int)uVar12 + 1);
            *exceptions = puVar7;
            *puVar5 = uVar4;
            puVar10 = (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            puVar10[uVar9] = ~uVar11 + uVar3;
            uVar9 = (ulong)uVar3;
          } while (uVar12 < uVar8);
        }
      }
      else {
        puVar10 = (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if (uVar8 != 1) {
          puVar5 = puVar5 + 2;
          uVar12 = 1;
          uVar13 = 2;
          do {
            uVar3 = (this->miss).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar12];
            uVar11 = puVar10[uVar3];
            *exceptions = puVar5;
            puVar5[-1] = uVar11;
            puVar5 = puVar5 + 1;
            puVar10 = (this->codedcopy).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            puVar10[uVar9] = ~(uint)uVar9 + uVar3;
            uVar12 = (ulong)uVar13;
            uVar13 = uVar13 + 1;
            uVar9 = (ulong)uVar3;
          } while (uVar12 < uVar8);
        }
      }
      usimdpack(puVar10,(__m128i *)outputbegin,b);
      return uVar2;
    }
    usimdpack(in,(__m128i *)outputbegin,b);
  }
  return 0x80;
}

Assistant:

uint32_t compressblockPFOR(const DATATYPE *__restrict__ in,
                             uint32_t *__restrict__ outputbegin,
                             const uint32_t b,
                             DATATYPE *__restrict__ &exceptions) {
    if (b == 32) {
      for (size_t k = 0; k < BlockSize; ++k)
        *(outputbegin++) = *(in++);
      return BlockSize;
    }
    size_t exceptcounter = 0;
    const uint32_t maxgap = 1U << b;
    {
      std::vector<uint32_t>::iterator cci = codedcopy.begin();
      for (uint32_t k = 0; k < BlockSize; ++k, ++cci) {
        miss[exceptcounter] = k;
        exceptcounter += (in[k] >= maxgap);
      }
    }
    if (exceptcounter == 0) {
      packblock(in, outputbegin, b);
      return BlockSize;
    }
    codedcopy.assign(in, in + BlockSize);
    uint32_t firstexcept = miss[0];
    uint32_t prev = 0;
    *(exceptions++) = codedcopy[firstexcept];
    prev = firstexcept;
    if (maxgap < BlockSize) {
      for (uint32_t i = 1; i < exceptcounter; ++i) {
        uint32_t cur = miss[i];
        // they don't include this part, but it is required:
        while (cur > maxgap + prev) {
          // compulsory exception
          uint32_t compulcur = prev + maxgap;
          *(exceptions++) = codedcopy[compulcur];
          codedcopy[prev] = maxgap - 1;
          prev = compulcur;
        }
        *(exceptions++) = codedcopy[cur];
        codedcopy[prev] = cur - prev - 1;
        prev = cur;
      }
    } else {
      for (uint32_t i = 1; i < exceptcounter; ++i) {
        uint32_t cur = miss[i];
        *(exceptions++) = codedcopy[cur];
        codedcopy[prev] = cur - prev - 1;
        prev = cur;
      }
    }
    packblock(&codedcopy[0], outputbegin, b);
    return firstexcept;
  }